

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

TypedDeleter<LLVMBC::AtomicCmpXchgInst> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::AtomicCmpXchgInst>,LLVMBC::AtomicCmpXchgInst*&>
          (LLVMContext *this,AtomicCmpXchgInst **u)

{
  AtomicCmpXchgInst *pAVar1;
  TypedDeleter<LLVMBC::AtomicCmpXchgInst> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::AtomicCmpXchgInst> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::AtomicCmpXchgInst> *)0x0) {
    pAVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001f3700;
    pTVar2->ptr = pAVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}